

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O3

bool pg::au(int *dst,int *src,int d,int k,int max,int maxopp,int pl)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  pg *this;
  size_t __n;
  long lVar11;
  int *b;
  undefined8 uStack_60;
  pg apStack_58 [4];
  int local_54;
  ulong local_50;
  undefined1 *local_48;
  ulong local_40;
  pg *local_38;
  
  local_48 = (undefined1 *)CONCAT44(local_48._4_4_,max);
  uVar7 = (ulong)(uint)k;
  uStack_60 = 0x1690b7;
  iVar4 = up(dst,src,d,k,pl);
  if (iVar4 == -1) {
    return (bool)(char)iVar4;
  }
  b = (int *)(ulong)(uint)k;
  local_38 = (pg *)CONCAT44(local_38._4_4_,maxopp);
  uVar6 = (long)b * 4 + 0xfU & 0xfffffffffffffff0;
  lVar2 = -uVar6;
  this = apStack_58 + lVar2;
  if (1 < k) {
    __n = 4;
    lVar11 = 0;
    uVar10 = (ulong)(k - 1);
    uVar5 = k - 2;
    uVar6 = (ulong)uVar5;
    do {
      iVar4 = (int)lVar11;
      uVar8 = (ulong)(uVar5 + iVar4);
      uVar1 = src[uVar8];
      local_54 = d;
      local_50 = uVar10;
      local_40 = uVar7;
      if (uVar1 == 0xffffffff) {
        local_48 = apStack_58;
        *(int *)(this + uVar8 * 4) = maxopp;
        if ((int)local_40 + iVar4 != 2) {
LAB_001691dc:
          local_38 = this;
          *(undefined8 *)(apStack_58 + lVar2 + -8) = 0x1691ef;
          memcpy(this,src,uVar8 << 2);
          uVar10 = local_50;
          this = local_38;
        }
LAB_001691fb:
        if ((int)uVar10 + iVar4 < (int)local_40) {
          *(undefined8 *)(apStack_58 + lVar2 + -8) = 0x16921c;
          memset(this + lVar11 * 4 + uVar10 * 4,0xff,__n);
        }
        uVar7 = local_40;
        iVar4 = local_54;
        *(undefined8 *)(apStack_58 + lVar2 + -8) = 0x16923b;
        iVar9 = pl;
        up((int *)this,(int *)this,iVar4,(int)uVar7,pl);
        *(undefined8 *)(apStack_58 + lVar2 + -8) = 0x16924c;
        bVar3 = pm_less(this,dst,b,pl,iVar9);
        if (bVar3) {
          *(undefined8 *)(apStack_58 + lVar2 + -8) = 0x169263;
          memcpy(dst,this,(long)b * 4);
        }
        uVar7 = 0;
        goto LAB_0016926c;
      }
      iVar9 = k + -2 + iVar4;
      if ((uVar1 & 1) == pl) {
        if (iVar9 != 0) {
          iVar9 = uVar1 + 2;
          if ((iVar9 <= (int)local_48) && (iVar9 <= src[uVar8 - 1])) {
            local_48 = apStack_58;
            *(int *)(this + uVar8 * 4) = iVar9;
LAB_001691d5:
            if (0 < (int)(uVar5 + iVar4)) goto LAB_001691dc;
            goto LAB_001691fb;
          }
        }
      }
      else {
        if (1 - pl < (int)uVar1) {
          local_48 = apStack_58;
          *(uint *)(this + uVar8 * 4) = uVar1 - 2;
          uVar10 = local_50;
          if (0 < (int)(uVar5 + iVar4)) {
            local_38 = this;
            *(undefined8 *)(apStack_58 + lVar2 + -8) = 0x1691b5;
            memcpy(this,src,uVar8 << 2);
            uVar10 = local_50;
            this = local_38;
          }
          goto LAB_001691fb;
        }
        if (iVar9 == 0) break;
        if (pl <= src[uVar8 - 1]) {
          local_48 = apStack_58;
          *(int *)(this + uVar8 * 4) = pl;
          goto LAB_001691d5;
        }
      }
      lVar11 = lVar11 + -1;
      __n = __n + 4;
    } while (uVar10 + lVar11 != 0);
  }
  goto LAB_00169281;
  while (uVar6 = uVar7 + 1, bVar3 = (long)b - 1U != uVar7, uVar7 = uVar6, bVar3) {
LAB_0016926c:
    uVar6 = uVar7;
    if (dst[uVar7] != src[uVar7]) break;
  }
LAB_00169281:
  return (bool)(char)uVar6;
}

Assistant:

static bool
au(int *dst, int *src, int d, int k, int max, int maxopp, int pl)
{
    // first compute normal update
    int j = up(dst, src, d, k, pl);
    if (j == -1) return false; // no difference, already smallest...

    // then compute antagonistic update and update the antagonistic measure
    int tmp[k];
    if (!bump(tmp, src, k, max, maxopp, pl)) return true; // no bump possible; but dst != src so return true
    up(tmp, tmp, d, k, pl);

    // use smallest updated measure
    if (pm_less(tmp, dst, k, pl)) {
        for (int i=0; i<k; i++) dst[i] = tmp[i];
    }

    // finally, check if different
    for (int i=0; i<k; i++) if (dst[i] != src[i]) return true;
    return false;
}